

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O1

bool __thiscall
ON_LocalZero1::NewtonRaphson
          (ON_LocalZero1 *this,double s0,double f0,double s1,double f1,int maxit,double *t)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  undefined8 uVar6;
  undefined8 in_XMM1_Qb;
  ulong uVar7;
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qb;
  double dVar8;
  double f;
  double d;
  double local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  bVar3 = true;
  if (((ABS(f1) < ABS(f0)) || (local_68 = s0, this->m_f_tolerance < ABS(f0))) &&
     (local_68 = s1, this->m_f_tolerance < ABS(f1))) {
    local_b8 = f1;
    uStack_b0 = in_XMM3_Qb;
    local_a8 = f0;
    uStack_a0 = in_XMM1_Qb;
    local_98 = s0;
    uStack_90 = in_XMM0_Qb;
    local_88 = s1;
    uStack_80 = in_XMM2_Qb;
    if (0.0 < f0) {
      local_b8 = f0;
      uStack_b0 = in_XMM1_Qb;
      local_a8 = f1;
      uStack_a0 = in_XMM3_Qb;
      local_98 = s1;
      uStack_90 = in_XMM2_Qb;
      local_88 = s0;
      uStack_80 = in_XMM0_Qb;
    }
    local_68 = (s0 + s1) * 0.5;
    uStack_60 = in_XMM0_Qb;
    iVar1 = (*this->_vptr_ON_LocalZero1[2])(local_68,this,&local_c0,&local_70,0);
    if ((char)iVar1 == '\0') {
LAB_00569294:
      local_68 = (double)(~-(ulong)(ABS(local_a8) <= ABS(local_b8)) & (ulong)local_88 |
                         (ulong)local_98 & -(ulong)(ABS(local_a8) <= ABS(local_b8)));
      bVar3 = false;
    }
    else if (this->m_f_tolerance < ABS(local_c0)) {
      if (local_b8 <= 0.0) {
LAB_005692df:
        local_68 = (double)(~-(ulong)(ABS(local_a8) <= ABS(local_b8)) & (ulong)local_88 |
                           (ulong)local_98 & -(ulong)(ABS(local_a8) <= ABS(local_b8)));
        bVar3 = false;
      }
      else {
        iVar1 = maxit + 1;
        local_50 = 0.0;
        dVar8 = ABS(local_88 - local_98);
        do {
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) goto LAB_005692df;
          if ((0.0 < ((local_88 - local_68) * local_70 + local_c0) *
                     ((local_98 - local_68) * local_70 + local_c0)) ||
             (ABS(local_50 * local_70) < ABS(local_c0 + local_c0))) {
            local_48 = (local_88 - local_98) * 0.5;
            dVar5 = local_98 + local_48;
            uStack_60 = uStack_90;
            uStack_40 = uStack_80;
            if ((dVar5 == local_98) && (!NAN(dVar5) && !NAN(local_98))) {
              uVar4 = -(ulong)(ABS(local_b8) < ABS(local_a8));
              uVar7 = ~uVar4 & (ulong)dVar5;
              goto LAB_005693c5;
            }
          }
          else {
            local_48 = -local_c0 / local_70;
            dVar5 = local_68 + local_48;
            if ((dVar5 == local_68) && (!NAN(dVar5) && !NAN(local_68))) {
              if (ABS(local_a8) < ABS(local_c0)) {
                local_c0 = local_a8;
                dVar5 = local_98;
              }
              uVar4 = -(ulong)(ABS(local_b8) < ABS(local_c0));
              uVar7 = ~uVar4 & (ulong)dVar5;
LAB_005693c5:
              local_68 = (double)((ulong)local_88 & uVar4 | uVar7);
              goto LAB_005692fa;
            }
            uStack_40 = 0x8000000000000000;
          }
          local_68 = dVar5;
          local_50 = dVar8;
          iVar2 = (*this->_vptr_ON_LocalZero1[2])(this,&local_c0,&local_70,0);
          if ((char)iVar2 == '\0') goto LAB_00569294;
          if (ABS(local_c0) <= this->m_f_tolerance) {
            if (ABS(local_a8) < ABS(local_c0)) {
              local_c0 = local_a8;
              *t = local_98;
            }
            bVar3 = true;
            local_68 = local_88;
            if (ABS(local_c0) <= ABS(local_b8)) {
              return true;
            }
            goto LAB_005692fa;
          }
          dVar5 = local_c0;
          uVar6 = 0;
          if (0.0 <= local_c0) {
            local_b8 = local_c0;
            uStack_b0 = 0;
            local_88 = local_68;
            uStack_80 = uStack_60;
            dVar5 = local_a8;
            uVar6 = uStack_a0;
          }
          local_98 = (double)(~-(ulong)(local_c0 < 0.0) & (ulong)local_98 |
                             -(ulong)(local_c0 < 0.0) & (ulong)local_68);
          dVar8 = local_48;
          local_a8 = dVar5;
          uStack_a0 = uVar6;
        } while (this->m_t_tolerance < ABS(local_88 - local_98));
        local_68 = (double)(~-(ulong)(ABS(dVar5) <= ABS(local_b8)) & (ulong)local_88 |
                           -(ulong)(ABS(dVar5) <= ABS(local_b8)) & (ulong)local_98);
      }
    }
  }
LAB_005692fa:
  *t = local_68;
  return bVar3;
}

Assistant:

bool ON_LocalZero1::NewtonRaphson( double s0, double f0,
                                    double s1, double f1,
                                    int maxit, double* t )
{
  // private function - input must satisfy
  //
  // 1) t is not nullptr
  //
  // 2) maxit >= 2
  //
  // 3) s0 != s1, 
  //
  // 4) f0 = f(s0), f1 = f(s1), 
  //
  // 5) either f0 < 0.0 and f1 > 0.0, or f0 > 0.0 and f1 < 0.0
  //
  // 6) f() is C0 on [s0,s1] and C2 on (s0,s1)
  //
  // 7) ds_tolerance >= 0.0 - the search for a zero will stop
  //    if the zero in bracketed in an interval that is no
  //    larger than ds_tolerance.
  //
  //    When in doubt, ds_tolerance = (fabs(s0) + fabs(s1))*ON_EPSILON
  //    works well.

  double s, f, d, x, ds, prevds;

  if ( fabs(f0) <= m_f_tolerance && fabs(f0) <= fabs(f1) ) {
    // |f(s0)| <= user specified stopping tolerance
    *t = s0;
    return true;
  }
  if ( fabs(f1) <= m_f_tolerance ) {
    // |f(s1)| <= user specified stopping tolerance
    *t = s1;
    return true;
  }

  if ( f0 > 0.0 ) {
    x = s0; s0 = s1; s1 = x;
    x = f0; f0 = f1; f1 = x;
  }

  s = 0.5*(s0+s1);
  if ( !Evaluate( s, &f, &d, 0 ) ) {
    *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
    return false;
  }

  if ( fabs(f) <= m_f_tolerance ) {
    // |f(s)| <= user specified stopping tolerance
    *t = s;
    return true;
  }

  if ( f1 <= 0.0 ) {
    *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
    return false;
  }

  ds = fabs(s1-s0);
  prevds = 0.0;

  while (maxit--) {
    if ( (f+(s0-s)*d)*(f+(s1-s)*d) > 0.0  // true if NR's line segment doesn't cross zero inside interval
         || fabs(2.0*f) > fabs(prevds*d)  // true if expected decrease in function value from previous step didn't happen
         ) {
      // bisect
      prevds = ds;
      ds = 0.5*(s1-s0);
      s = s0+ds;
      if ( s == s0 ) {
        // interval is too small to be divided using double division
        if ( fabs(f1) < fabs(f0) ) {
          s = s1;
        }
        *t = s;
        return true;
      }      
    }
    else {
      // Newton iterate
      prevds = ds;
      ds = -f/d;
      x = s;
      s += ds;
      if ( s == x ) {
        // Newton step size < smallest double than can be added to s
        if ( fabs(f0) < fabs(f) ) {
          f = f0;
          s = s0;
        }
        if ( fabs(f1) < fabs(f) ) {
          s = s1;
        }
        *t = s;
        return true;
      } 
    }

    if ( !Evaluate( s, &f, &d, 0 ) ) {
      *t = (fabs(f0) <= fabs(f1)) ? s0 : s1; // emergency bailout
      return false;
    }

    if ( fabs(f) <= m_f_tolerance ) {
      // |f(s)| <= user specified stopping tolerance
      if ( fabs(f0) < fabs(f) ) {
        f = f0;
        *t = s0;
      }
      if ( fabs(f1) < fabs(f) ) {
        *t = s1;
      }
      return true;
    }

    if ( f < 0.0 ) {
      f0 = f; // f0 needed for emergency bailout
      s0 = s;
    }
    else { // f > 0.0
      f1 = f; // f1 needed for emergency bailout
      s1 = s;
    }

    if ( fabs(s1-s0) <= m_t_tolerance ) {
      // a root has been bracketed to an interval that is small enough
      // to satisfy user.
      *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
      return true;
    }
  }

  *t = (fabs(f0) <= fabs(f1)) ? s0 : s1; // emergency bailout
  return false;
}